

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_loadn(ASMState *as,Reg r,cTValue *tv)

{
  x86Op xo;
  
  if (tv->u64 != 0) {
    xo = XO_MOVLPD;
    if ((as->flags >> 10 & 1) == 0) {
      xo = XO_MOVSD;
    }
    emit_rma(as,xo,r,tv);
    return;
  }
  emit_rr(as,XO_XORPS,r,r);
  return;
}

Assistant:

static void emit_loadn(ASMState *as, Reg r, cTValue *tv)
{
  if (tvispzero(tv))  /* Use xor only for +0. */
    emit_rr(as, XO_XORPS, r, r);
  else
    emit_rma(as, XMM_MOVRM(as), r, &tv->n);
}